

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.h
# Opt level: O2

void __thiscall
Logger<(Log)0>::createMessage<unsigned_long&,unsigned_long&>
          (Logger<(Log)0> *this,stringstream *msg,char *fmt,unsigned_long *arg,unsigned_long *args)

{
  char cVar1;
  bool bVar2;
  
  bVar2 = false;
  do {
    cVar1 = *fmt;
    do {
      if ((bVar2) || (cVar1 == '%')) {
        std::ostream::_M_insert<unsigned_long>((ulong)(msg + 0x10));
        createMessage<unsigned_long&>(this,msg,fmt + 1,args);
        return;
      }
      if (cVar1 == '\0') {
        return;
      }
      bVar2 = cVar1 == '\\';
    } while (cVar1 == '\\');
    std::operator<<((ostream *)(msg + 0x10),cVar1);
    fmt = fmt + 1;
  } while( true );
}

Assistant:

void createMessage(std::stringstream& msg, const char* fmt, 
                                                  Arg1&& arg, Args&&... args)
     {
       bool doSkipNext = false;
       while (*fmt != '%' && !doSkipNext)
       {
         doSkipNext = false;
         //Make sure we're not running past the end of our formatting string.
         if (*fmt == '\0')
           return;
           
         if (*fmt == '\\')
         { //Escape for the %sign
           doSkipNext = true;
         }
         else
         {
           msg << *fmt;
           fmt++;
         }
       }

       fmt++; //Consume the % sign
       msg << arg;
       createMessage(msg, fmt, args...); //and recursively call ourselve / the method below.
     }